

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O2

Abc_Cex_t *
Gia_ManGenerateCounter(Gia_Man_t *pAig,int iFrame,int iOut,int nWords,int iPat,Vec_Int_t *vCis2Ids)

{
  int iVar1;
  uint uVar2;
  Abc_Cex_t *pAVar3;
  void *__ptr;
  int iVar4;
  ulong uVar5;
  int i;
  int local_64;
  
  pAVar3 = Abc_CexAlloc(pAig->nRegs,pAig->vCis->nSize - pAig->nRegs,iFrame + 1);
  pAVar3->iFrame = iFrame;
  pAVar3->iPo = iOut;
  local_64 = pAVar3->nRegs;
  __ptr = malloc((long)nWords * 4);
  for (iVar4 = 0; iVar4 <= iFrame; iVar4 = iVar4 + 1) {
    for (i = 0; i < pAig->vCis->nSize - pAig->nRegs; i = i + 1) {
      iVar1 = Vec_IntEntry(vCis2Ids,i);
      uVar5 = (ulong)(uint)nWords;
      if (iVar1 < pAVar3->nPis) {
        for (; 0 < (int)uVar5; uVar5 = uVar5 - 1) {
          uVar2 = Gia_ManRandom(0);
          *(uint *)((long)__ptr + uVar5 * 4 + -4) = uVar2;
        }
        if ((*(uint *)((long)__ptr + (long)(iPat >> 5) * 4) & 1 << ((byte)iPat & 0x1f)) != 0) {
          (&pAVar3[1].iPo)[iVar1 + local_64 >> 5] =
               (&pAVar3[1].iPo)[iVar1 + local_64 >> 5] | 1 << ((byte)(iVar1 + local_64) & 0x1f);
        }
      }
    }
    local_64 = local_64 + pAVar3->nPis;
  }
  free(__ptr);
  return pAVar3;
}

Assistant:

Abc_Cex_t * Gia_ManGenerateCounter( Gia_Man_t * pAig, int iFrame, int iOut, int nWords, int iPat, Vec_Int_t * vCis2Ids )
{
    Abc_Cex_t * p;
    unsigned * pData;
    int f, i, w, iPioId, Counter;
    p = Abc_CexAlloc( Gia_ManRegNum(pAig), Gia_ManPiNum(pAig), iFrame+1 );
    p->iFrame = iFrame;
    p->iPo    = iOut;
    // fill in the binary data
    Counter = p->nRegs;
    pData = ABC_ALLOC( unsigned, nWords );
    for ( f = 0; f <= iFrame; f++, Counter += p->nPis )
    for ( i = 0; i < Gia_ManPiNum(pAig); i++ )
    {
        iPioId = Vec_IntEntry( vCis2Ids, i );
        if ( iPioId >= p->nPis )
            continue;
        for ( w = nWords-1; w >= 0; w-- )
            pData[w] = Gia_ManRandom( 0 );
        if ( Abc_InfoHasBit( pData, iPat ) )
            Abc_InfoSetBit( p->pData, Counter + iPioId );
    }
    ABC_FREE( pData );
    return p;
}